

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O0

int jbcoin::compare<256ul,void>(base_uint<256UL,_void> *a,base_uint<256UL,_void> *b)

{
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  byte *pbVar1;
  pair<const_unsigned_char_*,_const_unsigned_char_*> pVar2;
  undefined8 local_30;
  pair<const_unsigned_char_*,_const_unsigned_char_*> ret;
  base_uint<256UL,_void> *b_local;
  base_uint<256UL,_void> *a_local;
  
  __first1 = base_uint<256UL,_void>::cbegin(a);
  __last1 = base_uint<256UL,_void>::cend(a);
  __first2 = base_uint<256UL,_void>::cbegin(b);
  pVar2 = std::mismatch<unsigned_char_const*,unsigned_char_const*>(__first1,__last1,__first2);
  local_30 = pVar2.first;
  pbVar1 = base_uint<256UL,_void>::cend(a);
  if (local_30 == pbVar1) {
    a_local._4_4_ = 0;
  }
  else {
    ret.first = pVar2.second;
    if (*ret.first < *local_30) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

inline int compare (
    base_uint<Bits, Tag> const& a, base_uint<Bits, Tag> const& b)
{
    auto ret = std::mismatch (a.cbegin (), a.cend (), b.cbegin ());

    if (ret.first == a.cend ())
        return 0;

    // a > b
    if (*ret.first > *ret.second)
        return 1;

    // a < b
    return -1;
}